

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients SplittingStepCoefficients_Copy(SplittingStepCoefficients coefficients)

{
  undefined8 *in_RDI;
  SplittingStepCoefficients coefficientsCopy;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  SplittingStepCoefficients local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_8 = (SplittingStepCoefficients)0x0;
  }
  else {
    local_8 = SplittingStepCoefficients_Alloc(in_stack_0000001c,in_stack_00000018,in_stack_00000014)
    ;
    if (local_8 == (SplittingStepCoefficients)0x0) {
      local_8 = (SplittingStepCoefficients)0x0;
    }
    else {
      local_8->order = *(int *)((long)in_RDI + 0x1c);
      memcpy(local_8->alpha,(void *)*in_RDI,(long)*(int *)(in_RDI + 2) << 3);
      memcpy(**local_8->beta,(void *)**(undefined8 **)in_RDI[1],
             (long)(*(int *)(in_RDI + 2) * (*(int *)((long)in_RDI + 0x14) + 1) *
                   *(int *)(in_RDI + 3)) << 3);
    }
  }
  return local_8;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Copy(
  const SplittingStepCoefficients coefficients)
{
  if (coefficients == NULL) { return NULL; }

  SplittingStepCoefficients coefficientsCopy =
    SplittingStepCoefficients_Alloc(coefficients->sequential_methods,
                                    coefficients->stages,
                                    coefficients->partitions);
  if (coefficientsCopy == NULL) { return NULL; }

  coefficientsCopy->order = coefficients->order;
  memcpy(coefficientsCopy->alpha, coefficients->alpha,
         coefficients->sequential_methods * sizeof(sunrealtype));

  /* beta[0][0] points to the contiguous memory allocation, so we can copy it
     with a single memcpy */
  memcpy(coefficientsCopy->beta[0][0], coefficients->beta[0][0],
         coefficients->sequential_methods * (coefficients->stages + 1) *
           coefficients->partitions * sizeof(sunrealtype));

  return coefficientsCopy;
}